

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O3

void rng_init(RNG_state *newstate,int seed)

{
  state_t gen;
  uchar local_98 [17];
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  sha1_ctx local_78;
  
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  local_98[0x10] = (uchar)((uint)seed >> 0x18);
  local_87 = (undefined1)((uint)seed >> 0x10);
  local_86 = (undefined1)((uint)seed >> 8);
  local_85 = (undefined1)seed;
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  local_78.hash[0] = 0x67452301;
  local_78.hash[1] = 0xefcdab89;
  local_78.hash[2] = 0x98badcfe;
  local_78.hash[3] = 0x10325476;
  local_78.hash[4] = 0xc3d2e1f0;
  sha1_hash(local_98,0x14,&local_78);
  sha1_end(newstate,&local_78);
  return;
}

Assistant:

void rng_init(RNG_state *newstate, int seed)
{
  struct sha1_context ctx;
  struct state_t gen;
  int i;

  for (i=0; i < 16; i++) 
    gen.state[i] = 0;
  gen.state[16] = 0xFF & (seed >> 24);
  gen.state[17] = 0xFF & (seed >> 16);
  gen.state[18] = 0xFF & (seed >> 8);
  gen.state[19] = 0xFF & (seed >> 0);
  
  sha1_begin(&ctx);
  sha1_hash(gen.state, 20, &ctx);
  sha1_end(newstate, &ctx);
}